

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LoadIniSettingsFromDisk(char *ini_filename)

{
  char *ini_data;
  char *file_data;
  size_t file_data_size;
  char *ini_filename_local;
  
  file_data = (char *)0x0;
  file_data_size = (size_t)ini_filename;
  ini_data = (char *)ImFileLoadToMemory(ini_filename,"rb",(size_t *)&file_data,0);
  if (ini_data != (char *)0x0) {
    LoadIniSettingsFromMemory(ini_data,(size_t)file_data);
    MemFree(ini_data);
  }
  return;
}

Assistant:

void ImGui::LoadIniSettingsFromDisk(const char* ini_filename)
{
    size_t file_data_size = 0;
    char* file_data = (char*)ImFileLoadToMemory(ini_filename, "rb", &file_data_size);
    if (!file_data)
        return;
    LoadIniSettingsFromMemory(file_data, (size_t)file_data_size);
    ImGui::MemFree(file_data);
}